

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# walletdb.cpp
# Opt level: O1

bool __thiscall
wallet::WalletBatch::WriteCScript(WalletBatch *this,uint160 *hash,CScript *redeemScript)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  long in_FS_OFFSET;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_uint160>
  local_68;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  paVar1 = &local_68.first.field_2;
  local_68.first._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_68,DBKeys::CSCRIPT_abi_cxx11_,
             DAT_006d00b0 + DBKeys::CSCRIPT_abi_cxx11_);
  local_68.second.super_base_blob<160U>.m_data._M_elems._16_4_ =
       *(undefined4 *)((hash->super_base_blob<160U>).m_data._M_elems + 0x10);
  local_68.second.super_base_blob<160U>.m_data._M_elems._0_8_ =
       *(undefined8 *)(hash->super_base_blob<160U>).m_data._M_elems;
  local_68.second.super_base_blob<160U>.m_data._M_elems._8_8_ =
       *(undefined8 *)((hash->super_base_blob<160U>).m_data._M_elems + 8);
  bVar2 = WriteIC<std::pair<std::__cxx11::string,uint160>,CScript>
                    (this,&local_68,redeemScript,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_68.first._M_dataplus._M_p,local_68.first.field_2._M_allocated_capacity + 1
                   );
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool WalletBatch::WriteCScript(const uint160& hash, const CScript& redeemScript)
{
    return WriteIC(std::make_pair(DBKeys::CSCRIPT, hash), redeemScript, false);
}